

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O0

float __thiscall testgen::_bigrecord_Union__0__::get_float(_bigrecord_Union__0__ *this)

{
  string *msg;
  long *in_RDI;
  float fVar1;
  Exception *this_00;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (*in_RDI != 2) {
    msg = (string *)__cxa_allocate_exception(0x18);
    this_00 = (Exception *)&stack0xffffffffffffffd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    avro::Exception::Exception(this_00,msg);
    __cxa_throw(msg,&avro::Exception::typeinfo,avro::Exception::~Exception);
  }
  fVar1 = boost::any_cast<float>((any *)0x2c1469);
  return fVar1;
}

Assistant:

inline
float _bigrecord_Union__0__::get_float() const {
    if (idx_ != 2) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<float >(value_);
}